

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O2

Error __thiscall asmjit::RAPass::removeUnreachableCode(RAPass *this)

{
  CBNode **ppCVar1;
  CBNode *pCVar2;
  bool bVar3;
  byte bVar4;
  CBNode *node;
  CBNode *pCVar5;
  CBNode *pCVar6;
  Link *pLVar7;
  
  pLVar7 = (Link *)&this->_unreachableList;
  pCVar2 = this->_stop;
  do {
    do {
      pLVar7 = pLVar7->_next;
      if (pLVar7 == (Link *)0x0) {
        return 0;
      }
      node = pLVar7->_value;
    } while (((node == (CBNode *)0x0) || (node == pCVar2)) ||
            (pCVar5 = node, node->_prev == (CBNode *)0x0));
    do {
      pCVar6 = pCVar5;
      if (pCVar5->_passData != (void *)0x0) break;
      ppCVar1 = &pCVar5->_next;
      pCVar6 = pCVar2;
      pCVar5 = *ppCVar1;
    } while (*ppCVar1 != pCVar2);
    if (pCVar6 != node) {
      bVar4 = 1;
      do {
        pCVar5 = node->_next;
        if (((node->_flags & 4) != 0) ||
           (bVar3 = (bool)(node->_type != '\x04' & bVar4), bVar4 = 1, bVar3)) {
          CodeBuilder::removeNode((this->super_CBPass)._cb,node);
        }
        else {
          bVar4 = 0;
        }
        node = pCVar5;
      } while (pCVar5 != pCVar6);
    }
  } while( true );
}

Assistant:

Error RAPass::removeUnreachableCode() {
  ZoneList<CBNode*>::Link* link = _unreachableList.getFirst();
  CBNode* stop = getStop();

  while (link) {
    CBNode* node = link->getValue();
    if (node && node->getPrev() && node != stop) {
      // Locate all unreachable nodes.
      CBNode* first = node;
      do {
        if (node->hasPassData()) break;
        node = node->getNext();
      } while (node != stop);

      // Remove unreachable nodes that are neither informative nor directives.
      if (node != first) {
        CBNode* end = node;
        node = first;

        // NOTE: The strategy is as follows:
        // 1. The algorithm removes everything until it finds a first label.
        // 2. After the first label is found it removes only removable nodes.
        bool removeEverything = true;
        do {
          CBNode* next = node->getNext();
          bool remove = node->isRemovable();

          if (!remove) {
            if (node->isLabel())
              removeEverything = false;
            remove = removeEverything;
          }

          if (remove)
            cc()->removeNode(node);

          node = next;
        } while (node != end);
      }
    }

    link = link->getNext();
  }

  return kErrorOk;
}